

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::InsertInst
          (GraphicsRobustAccessPass *this,Instruction *where_inst,Op opcode,uint32_t type_id,
          uint32_t result_id,OperandList *operands)

{
  IRContext *pIVar1;
  Instruction *pIVar2;
  BasicBlock *pBVar3;
  mapped_type *ppBVar4;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_40;
  OperandList *local_38;
  
  (this->super_Pass).field_0x34 = 1;
  pIVar1 = (this->super_Pass).context_;
  local_38 = operands;
  pIVar2 = (Instruction *)operator_new(0x70);
  Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,result_id,local_38);
  local_40._M_head_impl = pIVar2;
  pIVar2 = Instruction::InsertBefore
                     (where_inst,
                      (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       *)&local_40);
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*((local_40._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             pIVar2);
  pBVar3 = IRContext::get_instr_block((this->super_Pass).context_,where_inst);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    local_40._M_head_impl = pIVar2;
    ppBVar4 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pIVar1->instr_to_block_,&local_40._M_head_impl);
    *ppBVar4 = pBVar3;
  }
  return pIVar2;
}

Assistant:

opt::Instruction* GraphicsRobustAccessPass::InsertInst(
    opt::Instruction* where_inst, spv::Op opcode, uint32_t type_id,
    uint32_t result_id, const Instruction::OperandList& operands) {
  module_status_.modified = true;
  auto* result = where_inst->InsertBefore(
      MakeUnique<Instruction>(context(), opcode, type_id, result_id, operands));
  context()->get_def_use_mgr()->AnalyzeInstDefUse(result);
  auto* basic_block = context()->get_instr_block(where_inst);
  context()->set_instr_block(result, basic_block);
  return result;
}